

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::subspan
          (span<int,_18446744073709551615UL> *this,size_type offset,size_type count)

{
  bool bVar1;
  size_type sVar2;
  pointer piVar3;
  size_type local_58;
  size_type count_local;
  size_type offset_local;
  span<int,_18446744073709551615UL> *this_local;
  
  bVar1 = detail::is_positive<unsigned_long>(offset);
  if (((!bVar1) || (sVar2 = size(this), sVar2 < offset)) ||
     ((count != 0xffffffffffffffff &&
      ((bVar1 = detail::is_positive<unsigned_long>(count), !bVar1 ||
       (sVar2 = size(this), sVar2 < offset + count)))))) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1209: Precondition violation."
              );
  }
  piVar3 = data(this);
  local_58 = count;
  if (count == 0xffffffffffffffff) {
    local_58 = size(this);
    local_58 = local_58 - offset;
  }
  span<int_*,_0>((span<int,_18446744073709551615UL> *)&this_local,piVar3 + offset,local_58);
  return _this_local;
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    subspan( size_type offset, size_type count = static_cast<size_type>(dynamic_extent) ) const
    {
        span_EXPECTS(
            ( ( detail::is_positive( offset ) && offset <= size() ) ) &&
            ( count == static_cast<size_type>(dynamic_extent) || ( detail::is_positive( count ) && offset + count <= size() ) )
        );

        return span< element_type, dynamic_extent >(
            data() + offset, count == static_cast<size_type>(dynamic_extent) ? size() - offset : count );
    }